

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall
crawler::JsonParser::parseLiteralness(JsonParser *this,string *literal,JsonType jsonType)

{
  size_type sVar1;
  bool bVar2;
  runtime_error *this_00;
  string compareData;
  
  sVar1 = literal->_M_string_length;
  std::__cxx11::string::substr((ulong)&compareData,(ulong)this);
  bVar2 = std::operator!=(literal,&compareData);
  if (!bVar2) {
    this->pos = this->pos + sVar1;
    (this->jsonValue).type = jsonType;
    std::__cxx11::string::~string((string *)&compareData);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"PARSE_INVALID_VALUE");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void crawler::JsonParser::parseLiteralness(const std::string &literal,
                                           crawler::JsonType jsonType) {
  size_t literalSize = literal.size();
  std::string compareData = json.substr(pos, literalSize);
  if (literal != compareData) {
    throw std::runtime_error("PARSE_INVALID_VALUE");
  }
  // move `pos` steps forward
  pos += literalSize;
  this->jsonValue.setType(jsonType);
}